

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O0

void intgemm::TestSelectColumnsB<intgemm::AVX2::Kernels8>(Index rows,Index cols)

{
  StringRef capturedExpression;
  ScopedMessage *this;
  float *pfVar1;
  MessageBuilder *pMVar2;
  MessageBuilder *pMVar3;
  MessageBuilder *this_00;
  ITransientExpression *expr;
  char *__s2;
  ExprLhs<const_int_&> this_01;
  int in_ESI;
  uint in_EDI;
  result_type_conflict rVar4;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage17;
  AlignedVector<signed_char> ref;
  int c;
  Index r;
  AlignedVector<float> selected;
  AlignedVector<signed_char> test;
  Index *it_1;
  Index *__end2_1;
  Index *__begin2_1;
  Index (*__range2_1) [24];
  uniform_int_distribution<unsigned_int> col_dist;
  Index select_cols [24];
  int kSelectCols;
  AlignedVector<signed_char> prepared;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  AlignedVector<float> input;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe918;
  Flags resultDisposition;
  MessageBuilder *in_stack_ffffffffffffe920;
  int8_t *in_stack_ffffffffffffe928;
  OfType type;
  SourceLineInfo *this_02;
  SourceLineInfo *in_stack_ffffffffffffe930;
  StringRef *in_stack_ffffffffffffe938;
  MessageBuilder *in_stack_ffffffffffffe940;
  undefined4 in_stack_ffffffffffffe958;
  float in_stack_ffffffffffffe95c;
  undefined4 in_stack_ffffffffffffe968;
  result_type_conflict1 in_stack_ffffffffffffe96c;
  SourceLineInfo local_1630;
  StringRef local_1620;
  string local_15c8 [32];
  string local_15a8 [44];
  Index in_stack_ffffffffffffea84;
  undefined1 in_stack_ffffffffffffea88 [16];
  float *in_stack_ffffffffffffea98;
  Index in_stack_ffffffffffffead0;
  Index in_stack_ffffffffffffead4;
  char *in_stack_ffffffffffffead8;
  AlignedVector<signed_char> local_14b8;
  int local_14a8;
  uint local_14a4;
  AlignedVector<float> local_14a0;
  AlignedVector<signed_char> local_1490;
  result_type_conflict1 *local_1480;
  result_type_conflict1 *local_1478;
  result_type_conflict1 *local_1470;
  result_type_conflict1 *local_1468;
  result_type_conflict1 local_1458 [24];
  result_type_conflict1 local_13f8 [3];
  undefined4 local_13ec;
  AlignedVector<signed_char> local_13e8 [2];
  float *local_13c8;
  float *local_13c0;
  float *local_13b8;
  AlignedVector<float> *local_13b0;
  AlignedVector<float> local_13a8 [314];
  int local_8;
  uint local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x2148c2);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)in_stack_ffffffffffffe920,
             (float)((ulong)in_stack_ffffffffffffe918 >> 0x20),SUB84(in_stack_ffffffffffffe918,0));
  AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)in_stack_ffffffffffffe930,(size_t)in_stack_ffffffffffffe928,
             (size_t)in_stack_ffffffffffffe920);
  local_13b0 = local_13a8;
  local_13b8 = AlignedVector<float>::begin(local_13b0);
  local_13c0 = AlignedVector<float>::end(local_13b0);
  for (; local_13b8 != local_13c0; local_13b8 = local_13b8 + 1) {
    local_13c8 = local_13b8;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)in_stack_ffffffffffffe920,
                       in_stack_ffffffffffffe918);
    *local_13c8 = rVar4;
  }
  AlignedVector<float>::size(local_13a8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe930,
             (size_t)in_stack_ffffffffffffe928,(size_t)in_stack_ffffffffffffe920);
  this = (ScopedMessage *)AlignedVector<float>::begin(local_13a8);
  AlignedVector<signed_char>::begin(local_13e8);
  AVX2::Kernels8::PrepareB
            (in_stack_ffffffffffffea98,in_stack_ffffffffffffea88._8_8_,
             in_stack_ffffffffffffea88._4_4_,in_stack_ffffffffffffea88._0_4_,
             in_stack_ffffffffffffea84);
  local_13ec = 0x18;
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)in_stack_ffffffffffffe920,
             (uint)((ulong)in_stack_ffffffffffffe918 >> 0x20),(uint)in_stack_ffffffffffffe918);
  local_1478 = local_13f8;
  local_1470 = local_1458;
  local_1468 = local_1470;
  for (; local_1470 != local_1478; local_1470 = local_1470 + 1) {
    local_1480 = local_1470;
    in_stack_ffffffffffffe96c =
         std::uniform_int_distribution<unsigned_int>::operator()
                   ((uniform_int_distribution<unsigned_int> *)in_stack_ffffffffffffe920,
                    in_stack_ffffffffffffe918);
    *local_1480 = in_stack_ffffffffffffe96c;
  }
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe930,
             (size_t)in_stack_ffffffffffffe928,(size_t)in_stack_ffffffffffffe920);
  AlignedVector<signed_char>::begin(local_13e8);
  AlignedVector<signed_char>::begin(&local_1490);
  AVX2::Kernels8::SelectColumnsB
            ((int8_t *)in_stack_ffffffffffffe930,in_stack_ffffffffffffe928,
             (Index)((ulong)in_stack_ffffffffffffe920 >> 0x20),(Index *)in_stack_ffffffffffffe918,
             (Index *)0x214b61);
  AlignedVector<float>::AlignedVector
            ((AlignedVector<float> *)in_stack_ffffffffffffe930,(size_t)in_stack_ffffffffffffe928,
             (size_t)in_stack_ffffffffffffe920);
  for (local_14a4 = 0; local_14a4 < local_4; local_14a4 = local_14a4 + 1) {
    for (local_14a8 = 0; local_14a8 < 0x18; local_14a8 = local_14a8 + 1) {
      pfVar1 = AlignedVector<float>::operator[]
                         (local_13a8,(ulong)(local_1458[local_14a8] + local_14a4 * local_8));
      in_stack_ffffffffffffe95c = *pfVar1;
      pfVar1 = AlignedVector<float>::operator[](&local_14a0,(ulong)(local_14a8 + local_14a4 * 0x18))
      ;
      *pfVar1 = in_stack_ffffffffffffe95c;
    }
  }
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe930,
             (size_t)in_stack_ffffffffffffe928,(size_t)in_stack_ffffffffffffe920);
  type = (OfType)((ulong)in_stack_ffffffffffffe928 >> 0x20);
  pfVar1 = AlignedVector<float>::begin(&local_14a0);
  AlignedVector<signed_char>::begin(&local_14b8);
  AVX2::Kernels8::PrepareB
            (in_stack_ffffffffffffea98,in_stack_ffffffffffffea88._8_8_,
             in_stack_ffffffffffffea88._4_4_,in_stack_ffffffffffffea88._0_4_,
             in_stack_ffffffffffffea84);
  operator____catch_sr((char *)in_stack_ffffffffffffe920,(size_t)in_stack_ffffffffffffe918);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)(local_15a8 + 0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc"
             ,0x9b);
  Catch::MessageBuilder::MessageBuilder
            (in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,type);
  pMVar2 = Catch::MessageBuilder::operator<<
                     (in_stack_ffffffffffffe920,(char (*) [12])in_stack_ffffffffffffe918);
  AlignedVector<signed_char>::begin(&local_14b8);
  PrintMatrix<signed_char>
            (in_stack_ffffffffffffead8,in_stack_ffffffffffffead4,in_stack_ffffffffffffead0);
  pMVar3 = Catch::MessageBuilder::operator<<
                     (in_stack_ffffffffffffe920,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffe918);
  AlignedVector<signed_char>::begin(&local_1490);
  PrintMatrix<signed_char>
            (in_stack_ffffffffffffead8,in_stack_ffffffffffffead4,in_stack_ffffffffffffead0);
  this_00 = Catch::MessageBuilder::operator<<
                      (in_stack_ffffffffffffe920,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe918);
  Catch::ScopedMessage::ScopedMessage
            (this,(MessageBuilder *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
  std::__cxx11::string::~string(local_15c8);
  std::__cxx11::string::~string(local_15a8);
  Catch::MessageBuilder::~MessageBuilder(in_stack_ffffffffffffe920);
  local_1620 = operator____catch_sr
                         ((char *)in_stack_ffffffffffffe920,(size_t)in_stack_ffffffffffffe918);
  resultDisposition = (Flags)((ulong)in_stack_ffffffffffffe918 >> 0x20);
  this_02 = &local_1630;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc"
             ,0x9b);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this_02);
  capturedExpression.m_size = (size_type)pMVar2;
  capturedExpression.m_start = (char *)pMVar3;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_00,(StringRef *)this_02,
             (SourceLineInfo *)in_stack_ffffffffffffe920,capturedExpression,resultDisposition);
  expr = (ITransientExpression *)AlignedVector<signed_char>::begin(&local_14b8);
  __s2 = AlignedVector<signed_char>::begin(&local_1490);
  memcmp(expr,__s2,(ulong)local_4 * 0x18);
  this_01 = Catch::Decomposer::operator<=((Decomposer *)expr,(int *)0x214ee6);
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)CONCAT44(in_stack_ffffffffffffe95c,in_stack_ffffffffffffe958),
             (int *)pfVar1);
  Catch::AssertionHandler::handleExpr((AssertionHandler *)this_01.m_lhs,expr);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x214f33);
  Catch::AssertionHandler::complete((AssertionHandler *)this_01.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_01.m_lhs);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)this_00);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x215082);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x21508f);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x21509c);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x2150a9);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x2150b6);
  return;
}

Assistant:

void TestSelectColumnsB(Index rows = 64, Index cols = 16) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-129.0, 129.0);
  AlignedVector<float> input(rows * cols);
  for (auto& it : input) {
    it = dist(gen);
  }
  using Integer = typename Routine::Integer;
  AlignedVector<Integer> prepared(input.size());
  Routine::PrepareB(input.begin(), prepared.begin(), 1, rows, cols);

  const int kSelectCols = 24;
  Index select_cols[kSelectCols];
  std::uniform_int_distribution<Index> col_dist(0, cols - 1);
  for (auto& it : select_cols) {
    it = col_dist(gen);
  }

  AlignedVector<Integer> test(rows * kSelectCols);
  Routine::SelectColumnsB(prepared.begin(), test.begin(), rows, select_cols, select_cols + kSelectCols);

  // Select columns manually in float space.
  AlignedVector<float> selected(rows * kSelectCols);
  for (Index r = 0; r < rows; ++r) {
    for (int c = 0; c < kSelectCols; ++c) {
      assert(c + r * kSelectCols < rows * kSelectCols);
      selected[c + r * kSelectCols] = input[select_cols[c] + r * cols];
    }
  }
  AlignedVector<Integer> ref(rows * kSelectCols);
  Routine::PrepareB(selected.begin(), ref.begin(), 1, rows, kSelectCols);
  CHECK_MESSAGE(memcmp(ref.begin(), test.begin(), sizeof(Integer) * rows * kSelectCols) == 0, "Reference:\n" <<
  	PrintMatrix(ref.begin(), rows, kSelectCols) << PrintMatrix(test.begin(), rows, kSelectCols));
}